

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemsave.c
# Opt level: O1

LispPTR vmem_save0(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  __uid_t _Var4;
  int iVar5;
  int iVar6;
  LispPTR LVar7;
  char *pcVar8;
  passwd *ppVar9;
  size_t sVar11;
  DLword *pDVar12;
  long lVar13;
  ulong uVar14;
  char host [255];
  char sysout [4096];
  char pathname [4096];
  char acStack_2118 [256];
  char local_2018 [8];
  char acStack_2010 [8];
  undefined1 auStack_2008 [4080];
  char local_1018 [4096];
  long lVar10;
  
  Lisp_errno = &Dummy_errno;
  uVar14 = (ulong)*args;
  if (uVar14 != 0) {
    if ((*args & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar14);
    }
    if (0xfd < (byte)((char)Lisp_world[uVar14 + 3] + 0xbbU)) {
      uVar2 = *args;
      if ((uVar2 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
      }
      iVar6 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      iVar5 = 0x1000;
      if (iVar6 < 0x1000) {
        iVar5 = iVar6;
      }
      lVar10 = (long)iVar5;
      if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
        if (iVar6 == 0) {
          pcVar8 = local_1018;
        }
        else {
          lVar10 = lVar10 + (ulong)(lVar10 == 0);
          pDVar12 = Lisp_world +
                    (ulong)Lisp_world[(ulong)uVar2 + 2] +
                    (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
          pcVar8 = local_1018;
          do {
            *pcVar8 = *(char *)((ulong)pDVar12 ^ 2);
            pcVar8 = pcVar8 + 1;
            pDVar12 = pDVar12 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
        *pcVar8 = '\0';
      }
      else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
        if (iVar6 != 0) {
          uVar3 = *(uint *)(Lisp_world + uVar2);
          uVar1 = Lisp_world[(ulong)uVar2 + 2];
          lVar13 = 0;
          do {
            local_1018[lVar13] =
                 *(char *)((long)Lisp_world + lVar13 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2
                          ^ 3);
            lVar13 = lVar13 + 1;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
        }
        local_1018[lVar10] = '\0';
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(local_1018,acStack_2118);
      iVar6 = unixpathname(local_1018,local_2018,0,0);
      if (iVar6 == 0) {
        return 0xe0001;
      }
      goto LAB_0013af75;
    }
  }
  pcVar8 = getenv("LDEDESTSYSOUT");
  if (pcVar8 == (char *)0x0) {
    _Var4 = getuid();
    ppVar9 = getpwuid(_Var4);
    if (ppVar9 == (passwd *)0x0) {
      return 0xe0006;
    }
    strcpy(local_2018,ppVar9->pw_dir);
    sVar11 = strlen(local_2018);
    builtin_strncpy(local_2018 + sVar11,"/lisp.vi",8);
    builtin_strncpy(acStack_2010 + sVar11,"rtualmem",8);
    auStack_2008[sVar11] = 0;
  }
  else if ((*pcVar8 == '~') && ((pcVar8[1] == '/' || (pcVar8[1] == '\0')))) {
    _Var4 = getuid();
    ppVar9 = getpwuid(_Var4);
    if (ppVar9 == (passwd *)0x0) {
      return 0xe0006;
    }
    strcpy(local_2018,ppVar9->pw_dir);
    strcat(local_2018,pcVar8 + 1);
  }
  else {
    strcpy(local_2018,pcVar8);
  }
LAB_0013af75:
  LVar7 = vmem_save(local_2018);
  return LVar7;
}

Assistant:

LispPTR vmem_save0(LispPTR *args)
{
  char *def;
  char pathname[MAXPATHLEN], sysout[MAXPATHLEN], host[MAXNAMLEN];
#ifdef DOS
  char pwd[MAXNAMLEN];
  char drive[1];
#else
  struct passwd *pwd;
#endif /* DOS */

  Lisp_errno = &Dummy_errno;

  if ((args[0] != NIL) && lispstringP(args[0])) {
    /* Check of lispstringP is safer for LispStringToCString */
    LispStringToCString(args[0], pathname, MAXPATHLEN);
    separate_host(pathname, host);
#ifdef DOS
    if (!unixpathname(pathname, sysout, 0, 0, drive, 0, 0)) return (BADFILENAME);
#else
    if (!unixpathname(pathname, sysout, 0, 0)) return (BADFILENAME);
#endif /* DOS */
    return (vmem_save(sysout));
  } else {
    if ((def = getenv("LDEDESTSYSOUT")) == 0) {
#ifdef DOS
      if (getcwd(pwd, MAXNAMLEN) == NULL) return (FILETIMEOUT);
      strcpy(sysout, pwd);
      strcat(sysout, "/lisp.vm");
#else
      pwd = getpwuid(getuid()); /* NEED TIMEOUT */
      if (pwd == (struct passwd *)NULL) return (FILETIMEOUT);
      strcpy(sysout, pwd->pw_dir);
      strcat(sysout, "/lisp.virtualmem");
#endif /* DOS */
    } else {
      if (*def == '~' && (*(def + 1) == '/' || *(def + 1) == '\0')) {
#ifdef DOS
        if (getcwd(pwd, MAXNAMLEN) == NULL) return (FILETIMEOUT);
        strcpy(sysout, pwd);
#else
        pwd = getpwuid(getuid()); /* NEED TIMEOUT */
        if (pwd == (struct passwd *)NULL) return (FILETIMEOUT);
        strcpy(sysout, pwd->pw_dir);
#endif /* DOS */
        strcat(sysout, def + 1);
      } else {
        strcpy(sysout, def);
      }
    }
    return (vmem_save(sysout));
  }
}